

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_directory.cpp
# Opt level: O0

FResourceFile * CheckDir(char *filename,FileReader *file,bool quiet)

{
  uint uVar1;
  FResourceFile *rf;
  bool quiet_local;
  FileReader *file_local;
  char *filename_local;
  
  filename_local = (char *)operator_new(0x30);
  FDirectory::FDirectory((FDirectory *)filename_local,filename);
  uVar1 = (*(((FDirectory *)filename_local)->super_FResourceFile)._vptr_FResourceFile[3])
                    (filename_local,(ulong)quiet);
  if ((uVar1 & 1) == 0) {
    if ((FDirectory *)filename_local != (FDirectory *)0x0) {
      (*(((FDirectory *)filename_local)->super_FResourceFile)._vptr_FResourceFile[1])();
    }
    filename_local = (char *)0x0;
  }
  return (FResourceFile *)filename_local;
}

Assistant:

FResourceFile *CheckDir(const char *filename, FileReader *file, bool quiet)
{
	FResourceFile *rf = new FDirectory(filename);
	if (rf->Open(quiet)) return rf;
	delete rf;
	return NULL;
}